

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

void __thiscall
dlib::
array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
::push_back(array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this,member_function_pointer<void,_void,_void,_void> *item)

{
  int iVar1;
  unsigned_long uVar2;
  undefined4 extraout_var;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *this_00;
  undefined4 extraout_var_01;
  member_function_pointer<void,_void,_void,_void> *in_RSI;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  unsigned_long i;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  temp;
  unsigned_long in_stack_00000198;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_000001a0;
  member_function_pointer<void,_void,_void,_void> *in_stack_ffffffffffffff48;
  member_function_pointer<void,_void,_void,_void> *in_stack_ffffffffffffff50;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *this_01;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_ffffffffffffff60;
  unsigned_long in_stack_ffffffffffffff68;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *item_00;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_ffffffffffffff70;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *local_68;
  array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
  local_50;
  member_function_pointer<void,_void,_void,_void> *local_10;
  undefined4 extraout_var_00;
  
  local_10 = in_RSI;
  uVar2 = max_size(in_RDI);
  iVar1 = (*(in_RDI->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
            _vptr_enumerable[8])();
  if (uVar2 == CONCAT44(extraout_var,iVar1)) {
    array(in_stack_ffffffffffffff60);
    (*(in_RDI->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
      _vptr_enumerable[8])();
    set_max_size(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    (*(in_RDI->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
      _vptr_enumerable[8])();
    set_size(in_stack_000001a0,in_stack_00000198);
    local_68 = (array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
                *)0x0;
    while( true ) {
      item_00 = local_68;
      iVar1 = (*(in_RDI->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
                _vptr_enumerable[8])();
      this_00 = (array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
                 *)CONCAT44(extraout_var_00,iVar1);
      if (this_00 <= item_00) break;
      operator[](in_RDI,(unsigned_long)local_68);
      operator[](&local_50,(unsigned_long)local_68);
      exchange<dlib::member_function_pointer<void,void,void,void>>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_68 = (array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
                  *)((long)&(local_68->
                            super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>
                            )._vptr_enumerable + 1);
    }
    this_01 = &local_50;
    uVar2 = size(this_01);
    operator[](this_01,uVar2 - 1);
    exchange<dlib::member_function_pointer<void,void,void,void>>
              ((member_function_pointer<void,_void,_void,_void> *)this_01,in_stack_ffffffffffffff48)
    ;
    swap(this_00,item_00);
    ~array(this_01);
  }
  else {
    (*(in_RDI->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
      _vptr_enumerable[8])();
    set_size(in_stack_000001a0,in_stack_00000198);
    iVar1 = (*(in_RDI->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
              _vptr_enumerable[8])();
    operator[](in_RDI,CONCAT44(extraout_var_01,iVar1) - 1);
    exchange<dlib::member_function_pointer<void,void,void,void>>(in_stack_ffffffffffffff50,local_10)
    ;
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    push_back (
        T& item
    ) 
    {
        if (this->max_size() == this->size())
        {
            // double the size of the array
            array temp;
            temp.set_max_size(this->size()*2 + 1);
            temp.set_size(this->size()+1);
            for (unsigned long i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            exchange(item,temp[temp.size()-1]);
            temp.swap(*this);
        }
        else
        {
            this->set_size(this->size()+1);
            exchange(item,(*this)[this->size()-1]);
        }
    }